

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file_buffer.h
# Opt level: O0

int __thiscall cppcms::http::impl::file_buffer::overflow(file_buffer *this,int c)

{
  int iVar1;
  long lVar2;
  long lVar3;
  reference pvVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  undefined1 *puVar8;
  int in_ESI;
  char *in_RDI;
  size_t new_size;
  size_t read_offset;
  size_t size;
  file_buffer *in_stack_ffffffffffffffa8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  
  lVar2 = std::streambuf::pptr();
  lVar3 = std::streambuf::pbase();
  if ((in_RDI[0x40] & 1U) == 0) {
    iVar1 = write_buffer(in_stack_ffffffffffffffa8);
    if (iVar1 != 0) {
      return -1;
    }
    pcVar5 = (char *)std::streambuf::pbase();
    std::streambuf::epptr();
    std::streambuf::setp(in_RDI,pcVar5);
  }
  else if ((ulong)(lVar2 - lVar3) < *(ulong *)(in_RDI + 0x50)) {
    lVar2 = std::streambuf::gptr();
    lVar3 = std::streambuf::eback();
    std::vector<char,_std::allocator<char>_>::size
              ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x98));
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x98),0);
    std::vector<char,_std::allocator<char>_>::operator[]
              ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x98),0);
    std::vector<char,_std::allocator<char>_>::size
              ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x98));
    std::streambuf::setp(in_RDI,pvVar4);
    std::streambuf::pbump((int)in_RDI);
    pcVar5 = (char *)std::streambuf::pbase();
    lVar6 = std::streambuf::pbase();
    pcVar7 = (char *)(lVar6 + (lVar2 - lVar3));
    std::streambuf::pptr();
    std::streambuf::setg(in_RDI,pcVar5,pcVar7);
  }
  else {
    iVar1 = to_file(in_stack_ffffffffffffffa8);
    if (iVar1 < 0) {
      return -1;
    }
  }
  if (in_ESI != -1) {
    puVar8 = (undefined1 *)std::streambuf::pptr();
    *puVar8 = (char)in_ESI;
    std::streambuf::pbump((int)in_RDI);
  }
  return 0;
}

Assistant:

int overflow(int c)
	{
		size_t size = pptr() - pbase();
		if(in_memory_) {
			if(size >= limit_) {
				if(to_file() < 0)
					return -1;
			}
			else {
				size_t read_offset =gptr() - eback();
				size_t new_size = data_.size() * 2;
				if(new_size == 0)
					new_size = 64;
				if(new_size > limit_)
					new_size = limit_;
				data_.resize(new_size);

				setp(&data_[0],&data_[0] + data_.size());
				pbump(size);

				setg(pbase(),pbase() + read_offset,pptr());
			}
		}
		else {
			if(write_buffer()!= 0)
				return -1;
			setp(pbase(),epptr());
		}
		if(c!=EOF) {
			*pptr() = c;
			pbump(1);
		}
		return 0;
	}